

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<kratos::DebugDatabase> * __thiscall
pybind11::class_<kratos::DebugDatabase>::
def<void(kratos::DebugDatabase::*)(kratos::Generator*),pybind11::arg>
          (class_<kratos::DebugDatabase> *this,char *name_,offset_in_Var_to_subr *f,arg *extra)

{
  name *extra_00;
  undefined1 local_68 [8];
  is_method local_60;
  handle local_58;
  offset_in_Var_to_subr local_50;
  object local_48;
  cpp_function local_40;
  cpp_function cf;
  
  local_50 = *f;
  extra_00 = (name *)f[1];
  local_58.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_60.class_.m_ptr = (handle)(handle)name_;
  cf.super_function.super_object.super_handle.m_ptr = (function)PyObject_GetAttrString();
  if ((handle)cf.super_function.super_object.super_handle.m_ptr == (handle)0x0) {
    PyErr_Clear();
    cf.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_68 = (undefined1  [8])cf.super_function.super_object.super_handle.m_ptr;
  cpp_function::
  cpp_function<void,kratos::DebugDatabase,kratos::Generator*,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg>
            (&local_40,local_50,extra_00,&local_60,(sibling *)&local_58,(arg *)local_68);
  object::~object((object *)&cf);
  object::~object(&local_48);
  detail::add_class_method((object *)this,name_,&local_40);
  object::~object((object *)&local_40);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }